

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenTablePost(CppGenerator *this,StructDef *struct_def)

{
  string *__return_storage_ptr__;
  FieldDef *field_00;
  Namespace *this_00;
  StructDef *pSVar1;
  undefined8 field_01;
  char *__s;
  bool bVar2;
  reference ppFVar3;
  ulong uVar4;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *this_01;
  Value *pVVar5;
  FieldDef *local_bd8;
  allocator<char> local_b31;
  string local_b30;
  allocator<char> local_b09;
  string local_b08;
  allocator<char> local_ae1;
  string local_ae0;
  string local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  string local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  allocator<char> local_9f9;
  string local_9f8;
  Value *local_9d8;
  Value *native_type;
  reference ppFStack_9c8;
  bool pass_by_address;
  FieldDef **field_2;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range3;
  string local_9a0;
  allocator<char> local_979;
  string local_978;
  string local_958;
  allocator<char> local_931;
  string local_930;
  allocator<char> local_909;
  string local_908;
  undefined1 local_8e8 [8];
  string qualified_create_name;
  string local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  string local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  undefined1 local_788 [8];
  string force_align_code;
  FieldDef *field_1;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_758;
  const_iterator it_1;
  string local_730;
  string local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  string local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  string local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  char *local_410;
  char *postfix;
  char *check;
  char *prefix;
  allocator<char> local_3d1;
  string local_3d0;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_3b0;
  undefined1 local_3a8 [8];
  string statement;
  bool is_union;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_370;
  const_iterator it;
  string local_360;
  allocator<char> local_339;
  string local_338;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  undefined1 local_158 [8];
  string native_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  StructDef *local_18;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  local_18 = struct_def;
  struct_def_local = (StructDef *)this;
  if (((this->opts_).super_IDLOptions.generate_object_based_api & 1U) != 0) {
    GenNativeTablePost(this,struct_def);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"STRUCT_NAME",&local_39);
  Name_abi_cxx11_(&local_70,this,&local_18->super_Definition);
  CodeWriter::SetValue(&this->code_,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"NATIVE_NAME",&local_91);
  Name_abi_cxx11_(&local_d8,this,&local_18->super_Definition);
  NativeName(&local_b8,&local_d8,local_18,&(this->opts_).super_IDLOptions);
  CodeWriter::SetValue(&this->code_,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  if (((this->opts_).super_IDLOptions.generate_object_based_api & 1U) != 0) {
    GenCopyCtorAssignOpDefs(this,local_18);
    __return_storage_ptr__ = (string *)((long)&native_name.field_2 + 8);
    TableUnPackSignature_abi_cxx11_
              (__return_storage_ptr__,this,local_18,false,&(this->opts_).super_IDLOptions);
    std::operator+(&local_118,"inline ",__return_storage_ptr__);
    std::operator+(&local_f8,&local_118," {");
    CodeWriter::operator+=(&this->code_,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)(native_name.field_2._M_local_buf + 8));
    if (*(int *)&(this->opts_).super_IDLOptions.field_0x30c == 0) {
      WrapNativeNameInNameSpace_abi_cxx11_
                ((string *)local_158,this,local_18,&((this->super_BaseGenerator).parser_)->opts);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"POINTER_TYPE",&local_179);
      GenTypeNativePtr(&local_1a0,this,(string *)local_158,(FieldDef *)0x0,false);
      CodeWriter::SetValue(&this->code_,&local_178,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator(&local_179);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,
                 "  {{POINTER_TYPE}} _o = {{POINTER_TYPE}}(new {{NATIVE_NAME}}());",&local_1c1);
      CodeWriter::operator+=(&this->code_,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
      std::__cxx11::string::~string((string *)local_158);
    }
    else if (*(int *)&(this->opts_).super_IDLOptions.field_0x30c == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,
                 "  auto _o = std::unique_ptr<{{NATIVE_NAME}}>(new {{NATIVE_NAME}}());",&local_1e9);
      CodeWriter::operator+=(&this->code_,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"  auto _o = std::make_unique<{{NATIVE_NAME}}>();",&local_211)
      ;
      CodeWriter::operator+=(&this->code_,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator(&local_211);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"  UnPackTo(_o.get(), _resolver);",&local_239);
    CodeWriter::operator+=(&this->code_,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"  return _o.release();",&local_261);
    CodeWriter::operator+=(&this->code_,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"}",&local_289);
    CodeWriter::operator+=(&this->code_,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"",&local_2b1);
    CodeWriter::operator+=(&this->code_,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    TableUnPackToSignature_abi_cxx11_
              (&local_318,this,local_18,false,&(this->opts_).super_IDLOptions);
    std::operator+(&local_2f8,"inline ",&local_318);
    std::operator+(&local_2d8,&local_2f8," {");
    CodeWriter::operator+=(&this->code_,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"  (void)_o;",&local_339);
    CodeWriter::operator+=(&this->code_,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"  (void)_resolver;",
               (allocator<char> *)((long)&it._M_current + 7));
    CodeWriter::operator+=(&this->code_,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    local_370._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                   (&(local_18->fields).vec);
    while( true ) {
      field = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        (&(local_18->fields).vec);
      bVar2 = __gnu_cxx::operator!=
                        (&local_370,
                         (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                          *)&field);
      if (!bVar2) break;
      ppFVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&local_370);
      field_00 = *ppFVar3;
      if ((field_00->deprecated & 1U) == 0) {
        statement.field_2._M_local_buf[0xf] = (field_00->value).type.base_type == BASE_TYPE_UTYPE;
        if ((bool)statement.field_2._M_local_buf[0xf]) {
          local_3b0 = __gnu_cxx::
                      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                      ::operator+(&local_370,1);
          ppFVar3 = __gnu_cxx::
                    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                    ::operator*(&local_3b0);
          local_bd8 = *ppFVar3;
        }
        else {
          local_bd8 = (FieldDef *)0x0;
        }
        GenUnpackFieldStatement_abi_cxx11_((string *)local_3a8,this,field_00,local_bd8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d0,"FIELD_NAME",&local_3d1);
        Name_abi_cxx11_((string *)&prefix,this,field_00);
        CodeWriter::SetValue(&this->code_,&local_3d0,(string *)&prefix);
        std::__cxx11::string::~string((string *)&prefix);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::allocator<char>::~allocator(&local_3d1);
        check = "  { auto _e = {{FIELD_NAME}}(); ";
        bVar2 = IsScalar((field_00->value).type.base_type);
        __s = check;
        postfix = "if (_e) ";
        if (bVar2) {
          postfix = "";
        }
        local_410 = " }";
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,__s,&local_491);
        std::operator+(&local_470,&local_490,postfix);
        std::operator+(&local_450,&local_470,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3a8);
        std::operator+(&local_430,&local_450,local_410);
        CodeWriter::operator+=(&this->code_,&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&local_470);
        std::__cxx11::string::~string((string *)&local_490);
        std::allocator<char>::~allocator(&local_491);
        std::__cxx11::string::~string((string *)local_3a8);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&local_370);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"}",&local_4b9);
    CodeWriter::operator+=(&this->code_,&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"",&local_4e1);
    CodeWriter::operator+=(&this->code_,&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::allocator<char>::~allocator(&local_4e1);
    TablePackSignature_abi_cxx11_(&local_548,this,local_18,false,&(this->opts_).super_IDLOptions);
    std::operator+(&local_528,"inline ",&local_548);
    std::operator+(&local_508,&local_528," {");
    CodeWriter::operator+=(&this->code_,&local_508);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_568,"  return Create{{STRUCT_NAME}}(_fbb, _o, _rehasher);",
               &local_569);
    CodeWriter::operator+=(&this->code_,&local_568);
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::~allocator(&local_569);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"}",&local_591);
    CodeWriter::operator+=(&this->code_,&local_590);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator(&local_591);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"",&local_5b9);
    CodeWriter::operator+=(&this->code_,&local_5b8);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::allocator<char>::~allocator(&local_5b9);
    TableCreateSignature_abi_cxx11_(&local_620,this,local_18,false,&(this->opts_).super_IDLOptions);
    std::operator+(&local_600,"inline ",&local_620);
    std::operator+(&local_5e0,&local_600," {");
    CodeWriter::operator+=(&this->code_,&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_640,"  (void)_rehasher;",&local_641);
    CodeWriter::operator+=(&this->code_,&local_640);
    std::__cxx11::string::~string((string *)&local_640);
    std::allocator<char>::~allocator(&local_641);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_668,"  (void)_o;",&local_669);
    CodeWriter::operator+=(&this->code_,&local_668);
    std::__cxx11::string::~string((string *)&local_668);
    std::allocator<char>::~allocator(&local_669);
    GetBuilder_abi_cxx11_(&local_710,this);
    std::operator+(&local_6f0,"  struct _VectorArgs { ",&local_710);
    std::operator+(&local_6d0,&local_6f0," *__fbb; const ");
    Name_abi_cxx11_((string *)&it_1,this,&local_18->super_Definition);
    NativeName(&local_730,(string *)&it_1,local_18,&(this->opts_).super_IDLOptions);
    std::operator+(&local_6b0,&local_6d0,&local_730);
    std::operator+(&local_690,&local_6b0,
                   "* __o; const ::flatbuffers::rehasher_function_t *__rehasher; } _va = { &_fbb, _o, _rehasher}; (void)_va;"
                  );
    CodeWriter::operator+=(&this->code_,&local_690);
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::__cxx11::string::~string((string *)&local_730);
    std::__cxx11::string::~string((string *)&it_1);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::__cxx11::string::~string((string *)&local_6f0);
    std::__cxx11::string::~string((string *)&local_710);
    local_758._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                   (&(local_18->fields).vec);
    while( true ) {
      field_1 = (FieldDef *)
                std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                          (&(local_18->fields).vec);
      bVar2 = __gnu_cxx::operator!=
                        (&local_758,
                         (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                          *)&field_1);
      if (!bVar2) break;
      ppFVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&local_758);
      force_align_code.field_2._8_8_ = *ppFVar3;
      if ((((FieldDef *)force_align_code.field_2._8_8_)->deprecated & 1U) == 0) {
        bVar2 = IsVector(&(((FieldDef *)force_align_code.field_2._8_8_)->value).type);
        field_01 = force_align_code.field_2._8_8_;
        if (bVar2) {
          Name_abi_cxx11_(&local_7e8,this,(FieldDef *)force_align_code.field_2._8_8_);
          std::operator+(&local_7c8,"_o->",&local_7e8);
          std::operator+(&local_7a8,&local_7c8,".size()");
          GenVectorForceAlign((string *)local_788,this,(FieldDef *)field_01,&local_7a8);
          std::__cxx11::string::~string((string *)&local_7a8);
          std::__cxx11::string::~string((string *)&local_7c8);
          std::__cxx11::string::~string((string *)&local_7e8);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            std::operator+(&local_808,"  ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_788);
            CodeWriter::operator+=(&this->code_,&local_808);
            std::__cxx11::string::~string((string *)&local_808);
          }
          std::__cxx11::string::~string((string *)local_788);
        }
        Name_abi_cxx11_(&local_8a8,this,(FieldDef *)force_align_code.field_2._8_8_);
        std::operator+(&local_888,"  auto _",&local_8a8);
        std::operator+(&local_868,&local_888," = ");
        GenCreateParam_abi_cxx11_
                  ((string *)((long)&qualified_create_name.field_2 + 8),this,
                   (FieldDef *)force_align_code.field_2._8_8_);
        std::operator+(&local_848,&local_868,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&qualified_create_name.field_2 + 8));
        std::operator+(&local_828,&local_848,";");
        CodeWriter::operator+=(&this->code_,&local_828);
        std::__cxx11::string::~string((string *)&local_828);
        std::__cxx11::string::~string((string *)&local_848);
        std::__cxx11::string::~string((string *)(qualified_create_name.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_868);
        std::__cxx11::string::~string((string *)&local_888);
        std::__cxx11::string::~string((string *)&local_8a8);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&local_758);
    }
    this_00 = (local_18->super_Definition).defined_namespace;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"Create",&local_909);
    Namespace::GetFullyQualifiedName((string *)local_8e8,this_00,&local_908,1000);
    std::__cxx11::string::~string((string *)&local_908);
    std::allocator<char>::~allocator(&local_909);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_930,"CREATE_NAME",&local_931);
    TranslateNameSpace(&local_958,(string *)local_8e8);
    CodeWriter::SetValue(&this->code_,&local_930,&local_958);
    std::__cxx11::string::~string((string *)&local_958);
    std::__cxx11::string::~string((string *)&local_930);
    std::allocator<char>::~allocator(&local_931);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_978,"  return {{CREATE_NAME}}{{STRUCT_NAME}}(",&local_979);
    CodeWriter::operator+=(&this->code_,&local_978);
    std::__cxx11::string::~string((string *)&local_978);
    std::allocator<char>::~allocator(&local_979);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9a0,"      _fbb\\",(allocator<char> *)((long)&__range3 + 7));
    CodeWriter::operator+=(&this->code_,&local_9a0);
    std::__cxx11::string::~string((string *)&local_9a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    this_01 = &(local_18->fields).vec;
    __end3 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                       (this_01);
    field_2 = (FieldDef **)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        (this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                       *)&field_2), bVar2) {
      ppFStack_9c8 = __gnu_cxx::
                     __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                     ::operator*(&__end3);
      if (((*ppFStack_9c8)->deprecated & 1U) == 0) {
        native_type._7_1_ = 0;
        if ((((*ppFStack_9c8)->value).type.base_type == BASE_TYPE_STRUCT) &&
           (bVar2 = IsStruct(&((*ppFStack_9c8)->value).type), bVar2)) {
          pSVar1 = ((*ppFStack_9c8)->value).type.struct_def;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9f8,"native_type",&local_9f9);
          pVVar5 = SymbolTable<flatbuffers::Value>::Lookup
                             (&(pSVar1->super_Definition).attributes,&local_9f8);
          std::__cxx11::string::~string((string *)&local_9f8);
          std::allocator<char>::~allocator(&local_9f9);
          local_9d8 = pVVar5;
          if (pVVar5 != (Value *)0x0) {
            native_type._7_1_ = 1;
          }
        }
        if ((native_type._7_1_ & 1) == 0) {
          Name_abi_cxx11_(&local_ac0,this,*ppFStack_9c8);
          std::operator+(&local_aa0,",\n      _",&local_ac0);
          std::operator+(&local_a80,&local_aa0,"\\");
          CodeWriter::operator+=(&this->code_,&local_a80);
          std::__cxx11::string::~string((string *)&local_a80);
          std::__cxx11::string::~string((string *)&local_aa0);
          std::__cxx11::string::~string((string *)&local_ac0);
        }
        else {
          Name_abi_cxx11_(&local_a60,this,*ppFStack_9c8);
          std::operator+(&local_a40,",\n      &_",&local_a60);
          std::operator+(&local_a20,&local_a40,"\\");
          CodeWriter::operator+=(&this->code_,&local_a20);
          std::__cxx11::string::~string((string *)&local_a20);
          std::__cxx11::string::~string((string *)&local_a40);
          std::__cxx11::string::~string((string *)&local_a60);
        }
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&__end3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae0,");",&local_ae1);
    CodeWriter::operator+=(&this->code_,&local_ae0);
    std::__cxx11::string::~string((string *)&local_ae0);
    std::allocator<char>::~allocator(&local_ae1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b08,"}",&local_b09);
    CodeWriter::operator+=(&this->code_,&local_b08);
    std::__cxx11::string::~string((string *)&local_b08);
    std::allocator<char>::~allocator(&local_b09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b30,"",&local_b31);
    CodeWriter::operator+=(&this->code_,&local_b30);
    std::__cxx11::string::~string((string *)&local_b30);
    std::allocator<char>::~allocator(&local_b31);
    std::__cxx11::string::~string((string *)local_8e8);
  }
  return;
}

Assistant:

void GenTablePost(const StructDef &struct_def) {
    if (opts_.generate_object_based_api) { GenNativeTablePost(struct_def); }

    code_.SetValue("STRUCT_NAME", Name(struct_def));
    code_.SetValue("NATIVE_NAME",
                   NativeName(Name(struct_def), &struct_def, opts_));

    if (opts_.generate_object_based_api) {
      // Generate the >= C++11 copy ctor and assignment operator definitions.
      GenCopyCtorAssignOpDefs(struct_def);

      // Generate the X::UnPack() method.
      code_ +=
          "inline " + TableUnPackSignature(struct_def, false, opts_) + " {";

      if (opts_.g_cpp_std == cpp::CPP_STD_X0) {
        auto native_name = WrapNativeNameInNameSpace(struct_def, parser_.opts);
        code_.SetValue("POINTER_TYPE",
                       GenTypeNativePtr(native_name, nullptr, false));
        code_ +=
            "  {{POINTER_TYPE}} _o = {{POINTER_TYPE}}(new {{NATIVE_NAME}}());";
      } else if (opts_.g_cpp_std == cpp::CPP_STD_11) {
        code_ +=
            "  auto _o = std::unique_ptr<{{NATIVE_NAME}}>(new "
            "{{NATIVE_NAME}}());";
      } else {
        code_ += "  auto _o = std::make_unique<{{NATIVE_NAME}}>();";
      }
      code_ += "  UnPackTo(_o.get(), _resolver);";
      code_ += "  return _o.release();";
      code_ += "}";
      code_ += "";
      code_ +=
          "inline " + TableUnPackToSignature(struct_def, false, opts_) + " {";
      code_ += "  (void)_o;";
      code_ += "  (void)_resolver;";

      for (auto it = struct_def.fields.vec.begin();
           it != struct_def.fields.vec.end(); ++it) {
        const auto &field = **it;
        if (field.deprecated) { continue; }

        // Assign a value from |this| to |_o|.   Values from |this| are stored
        // in a variable |_e| by calling this->field_type().  The value is then
        // assigned to |_o| using the GenUnpackFieldStatement.
        const bool is_union = field.value.type.base_type == BASE_TYPE_UTYPE;
        const auto statement =
            GenUnpackFieldStatement(field, is_union ? *(it + 1) : nullptr);

        code_.SetValue("FIELD_NAME", Name(field));
        auto prefix = "  { auto _e = {{FIELD_NAME}}(); ";
        auto check = IsScalar(field.value.type.base_type) ? "" : "if (_e) ";
        auto postfix = " }";
        code_ += std::string(prefix) + check + statement + postfix;
      }
      code_ += "}";
      code_ += "";

      // Generate the X::Pack member function that simply calls the global
      // CreateX function.
      code_ += "inline " + TablePackSignature(struct_def, false, opts_) + " {";
      code_ += "  return Create{{STRUCT_NAME}}(_fbb, _o, _rehasher);";
      code_ += "}";
      code_ += "";

      // Generate a CreateX method that works with an unpacked C++ object.
      code_ +=
          "inline " + TableCreateSignature(struct_def, false, opts_) + " {";
      code_ += "  (void)_rehasher;";
      code_ += "  (void)_o;";

      code_ +=
          "  struct _VectorArgs "
          "{ " +
          GetBuilder() +
          " *__fbb; "
          "const " +
          NativeName(Name(struct_def), &struct_def, opts_) +
          "* __o; "
          "const ::flatbuffers::rehasher_function_t *__rehasher; } _va = { "
          "&_fbb, _o, _rehasher}; (void)_va;";

      for (auto it = struct_def.fields.vec.begin();
           it != struct_def.fields.vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) { continue; }
        if (IsVector(field.value.type)) {
          const std::string force_align_code =
              GenVectorForceAlign(field, "_o->" + Name(field) + ".size()");
          if (!force_align_code.empty()) { code_ += "  " + force_align_code; }
        }
        code_ += "  auto _" + Name(field) + " = " + GenCreateParam(field) + ";";
      }
      // Need to call "Create" with the struct namespace.
      const auto qualified_create_name =
          struct_def.defined_namespace->GetFullyQualifiedName("Create");
      code_.SetValue("CREATE_NAME", TranslateNameSpace(qualified_create_name));

      code_ += "  return {{CREATE_NAME}}{{STRUCT_NAME}}(";
      code_ += "      _fbb\\";
      for (const auto &field : struct_def.fields.vec) {
        if (field->deprecated) { continue; }

        bool pass_by_address = false;
        if (field->value.type.base_type == BASE_TYPE_STRUCT) {
          if (IsStruct(field->value.type)) {
            auto native_type =
                field->value.type.struct_def->attributes.Lookup("native_type");
            if (native_type) { pass_by_address = true; }
          }
        }

        // Call the CreateX function using values from |_o|.
        if (pass_by_address) {
          code_ += ",\n      &_" + Name(*field) + "\\";
        } else {
          code_ += ",\n      _" + Name(*field) + "\\";
        }
      }
      code_ += ");";
      code_ += "}";
      code_ += "";
    }
  }